

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O0

void initPyData(void)

{
  initializer_list<std::pair<char,_QLatin1String>_> list;
  initializer_list<std::pair<char,_QLatin1String>_> list_00;
  initializer_list<std::pair<char,_QLatin1String>_> list_01;
  initializer_list<std::pair<char,_QLatin1String>_> list_02;
  QLatin1String local_16b8;
  char local_16a1;
  pair<char,_QLatin1String> local_16a0;
  iterator local_1688;
  undefined8 local_1680;
  QMultiHash<char,_QLatin1String> local_1678;
  QLatin1String local_1668;
  char local_1651;
  QLatin1String local_1650;
  char local_1639;
  QLatin1String local_1638;
  char local_1621;
  QLatin1String local_1620;
  char local_1609;
  QLatin1String local_1608;
  char local_15f1;
  QLatin1String local_15f0;
  char local_15d9;
  QLatin1String local_15d8;
  char local_15c1;
  QLatin1String local_15c0;
  char local_15a9;
  QLatin1String local_15a8;
  char local_1591;
  QLatin1String local_1590;
  char local_1579;
  QLatin1String local_1578;
  char local_1561;
  QLatin1String local_1560;
  char local_1549;
  QLatin1String local_1548;
  char local_1531;
  QLatin1String local_1530;
  char local_1519;
  QLatin1String local_1518;
  char local_1501;
  QLatin1String local_1500;
  char local_14e9;
  QLatin1String local_14e8;
  char local_14d1;
  QLatin1String local_14d0;
  char local_14b9;
  QLatin1String local_14b8;
  char local_14a1;
  QLatin1String local_14a0;
  char local_1489;
  QLatin1String local_1488;
  char local_1471;
  QLatin1String local_1470;
  char local_1459;
  QLatin1String local_1458;
  char local_1441;
  QLatin1String local_1440;
  char local_1429;
  QLatin1String local_1428;
  char local_1411;
  QLatin1String local_1410;
  char local_13f9;
  QLatin1String local_13f8;
  char local_13e1;
  QLatin1String local_13e0;
  char local_13c9;
  QLatin1String local_13c8;
  char local_13b1;
  QLatin1String local_13b0;
  char local_1399;
  QLatin1String local_1398;
  char local_1381;
  QLatin1String local_1380;
  char local_1369;
  QLatin1String local_1368;
  char local_1351;
  QLatin1String local_1350;
  char local_1339;
  QLatin1String local_1338;
  char local_1321;
  QLatin1String local_1320;
  char local_1309;
  QLatin1String local_1308;
  char local_12f1;
  QLatin1String local_12f0;
  char local_12d9;
  QLatin1String local_12d8;
  char local_12c1;
  QLatin1String local_12c0;
  char local_12a9;
  QLatin1String local_12a8;
  char local_1291;
  QLatin1String local_1290;
  char local_1279;
  QLatin1String local_1278;
  char local_1261;
  QLatin1String local_1260;
  char local_1249;
  QLatin1String local_1248;
  char local_1231;
  QLatin1String local_1230;
  char local_1219;
  QLatin1String local_1218;
  char local_1201;
  QLatin1String local_1200;
  char local_11e9;
  QLatin1String local_11e8;
  char local_11d1;
  QLatin1String local_11d0;
  char local_11b9;
  QLatin1String local_11b8;
  char local_11a1;
  QLatin1String local_11a0;
  char local_1189;
  QLatin1String local_1188;
  char local_1171;
  QLatin1String local_1170;
  char local_1159;
  QLatin1String local_1158;
  char local_1141;
  QLatin1String local_1140;
  char local_1129;
  QLatin1String local_1128;
  char local_1111;
  QLatin1String local_1110;
  char local_10f9;
  QLatin1String local_10f8;
  char local_10e1;
  QLatin1String local_10e0;
  char local_10c9;
  QLatin1String local_10c8;
  char local_10b1;
  QLatin1String local_10b0;
  char local_1099;
  QLatin1String local_1098;
  char local_1081;
  QLatin1String local_1080;
  char local_1069;
  QLatin1String local_1068;
  char local_1051;
  QLatin1String local_1050;
  char local_1039;
  QLatin1String local_1038;
  char local_1021;
  QLatin1String local_1020;
  char local_1009;
  QLatin1String local_1008;
  char local_ff1;
  QLatin1String local_ff0;
  char local_fd9;
  QLatin1String local_fd8;
  char local_fc1;
  QLatin1String local_fc0;
  char local_fa9;
  QLatin1String local_fa8;
  char local_f91;
  QLatin1String local_f90;
  char local_f79;
  QLatin1String local_f78;
  char local_f61;
  QLatin1String local_f60;
  char local_f49;
  QLatin1String local_f48;
  char local_f31;
  QLatin1String local_f30;
  char local_f19;
  QLatin1String local_f18;
  char local_f01;
  QLatin1String local_f00;
  char local_ee9;
  QLatin1String local_ee8;
  char local_ed1;
  pair<char,_QLatin1String> local_ed0;
  pair<char,_QLatin1String> pStack_eb8;
  pair<char,_QLatin1String> pStack_ea0;
  pair<char,_QLatin1String> pStack_e88;
  pair<char,_QLatin1String> pStack_e70;
  pair<char,_QLatin1String> pStack_e58;
  pair<char,_QLatin1String> pStack_e40;
  pair<char,_QLatin1String> pStack_e28;
  pair<char,_QLatin1String> pStack_e10;
  pair<char,_QLatin1String> pStack_df8;
  pair<char,_QLatin1String> pStack_de0;
  pair<char,_QLatin1String> pStack_dc8;
  pair<char,_QLatin1String> pStack_db0;
  pair<char,_QLatin1String> pStack_d98;
  pair<char,_QLatin1String> pStack_d80;
  pair<char,_QLatin1String> pStack_d68;
  pair<char,_QLatin1String> pStack_d50;
  pair<char,_QLatin1String> pStack_d38;
  pair<char,_QLatin1String> pStack_d20;
  pair<char,_QLatin1String> pStack_d08;
  pair<char,_QLatin1String> pStack_cf0;
  pair<char,_QLatin1String> pStack_cd8;
  pair<char,_QLatin1String> pStack_cc0;
  pair<char,_QLatin1String> pStack_ca8;
  pair<char,_QLatin1String> pStack_c90;
  pair<char,_QLatin1String> pStack_c78;
  pair<char,_QLatin1String> pStack_c60;
  pair<char,_QLatin1String> pStack_c48;
  pair<char,_QLatin1String> pStack_c30;
  pair<char,_QLatin1String> pStack_c18;
  pair<char,_QLatin1String> pStack_c00;
  pair<char,_QLatin1String> pStack_be8;
  pair<char,_QLatin1String> pStack_bd0;
  pair<char,_QLatin1String> pStack_bb8;
  pair<char,_QLatin1String> pStack_ba0;
  pair<char,_QLatin1String> pStack_b88;
  pair<char,_QLatin1String> pStack_b70;
  pair<char,_QLatin1String> pStack_b58;
  pair<char,_QLatin1String> pStack_b40;
  pair<char,_QLatin1String> pStack_b28;
  pair<char,_QLatin1String> pStack_b10;
  pair<char,_QLatin1String> pStack_af8;
  pair<char,_QLatin1String> pStack_ae0;
  pair<char,_QLatin1String> pStack_ac8;
  pair<char,_QLatin1String> pStack_ab0;
  pair<char,_QLatin1String> pStack_a98;
  pair<char,_QLatin1String> pStack_a80;
  pair<char,_QLatin1String> pStack_a68;
  pair<char,_QLatin1String> pStack_a50;
  pair<char,_QLatin1String> pStack_a38;
  pair<char,_QLatin1String> pStack_a20;
  pair<char,_QLatin1String> pStack_a08;
  pair<char,_QLatin1String> pStack_9f0;
  pair<char,_QLatin1String> pStack_9d8;
  pair<char,_QLatin1String> pStack_9c0;
  pair<char,_QLatin1String> pStack_9a8;
  pair<char,_QLatin1String> pStack_990;
  pair<char,_QLatin1String> pStack_978;
  pair<char,_QLatin1String> pStack_960;
  pair<char,_QLatin1String> pStack_948;
  pair<char,_QLatin1String> pStack_930;
  pair<char,_QLatin1String> pStack_918;
  pair<char,_QLatin1String> pStack_900;
  pair<char,_QLatin1String> pStack_8e8;
  pair<char,_QLatin1String> pStack_8d0;
  pair<char,_QLatin1String> pStack_8b8;
  pair<char,_QLatin1String> pStack_8a0;
  pair<char,_QLatin1String> pStack_888;
  pair<char,_QLatin1String> pStack_870;
  pair<char,_QLatin1String> pStack_858;
  pair<char,_QLatin1String> pStack_840;
  pair<char,_QLatin1String> pStack_828;
  pair<char,_QLatin1String> pStack_810;
  pair<char,_QLatin1String> pStack_7f8;
  pair<char,_QLatin1String> pStack_7e0;
  pair<char,_QLatin1String> pStack_7c8;
  pair<char,_QLatin1String> pStack_7b0;
  pair<char,_QLatin1String> pStack_798;
  pair<char,_QLatin1String> pStack_780;
  pair<char,_QLatin1String> pStack_768;
  pair<char,_QLatin1String> pStack_750;
  iterator local_738;
  undefined8 local_730;
  QMultiHash<char,_QLatin1String> local_728;
  QLatin1String local_718;
  char local_701;
  QLatin1String local_700;
  char local_6e9;
  QLatin1String local_6e8;
  char local_6d1;
  pair<char,_QLatin1String> local_6d0;
  pair<char,_QLatin1String> pStack_6b8;
  pair<char,_QLatin1String> pStack_6a0;
  iterator local_688;
  undefined8 local_680;
  QMultiHash<char,_QLatin1String> local_678;
  QMultiHash<char,_QLatin1String> local_668;
  QLatin1String local_658;
  char local_641;
  QLatin1String local_640;
  char local_629;
  QLatin1String local_628;
  char local_611;
  QLatin1String local_610;
  char local_5f9;
  QLatin1String local_5f8;
  char local_5e1;
  QLatin1String local_5e0;
  char local_5c9;
  QLatin1String local_5c8;
  char local_5b1;
  QLatin1String local_5b0;
  char local_599;
  QLatin1String local_598;
  char local_581;
  QLatin1String local_580;
  char local_569;
  QLatin1String local_568;
  char local_551;
  QLatin1String local_550;
  char local_539;
  QLatin1String local_538;
  char local_521;
  QLatin1String local_520;
  char local_509;
  QLatin1String local_508;
  char local_4f1;
  QLatin1String local_4f0;
  char local_4d9;
  QLatin1String local_4d8;
  char local_4c1;
  QLatin1String local_4c0;
  char local_4a9;
  QLatin1String local_4a8;
  char local_491;
  QLatin1String local_490;
  char local_479;
  QLatin1String local_478;
  char local_461;
  QLatin1String local_460;
  char local_449;
  QLatin1String local_448;
  char local_431;
  QLatin1String local_430;
  char local_419;
  QLatin1String local_418;
  char local_401;
  QLatin1String local_400;
  char local_3e9;
  QLatin1String local_3e8;
  char local_3d1;
  QLatin1String local_3d0;
  char local_3b9;
  QLatin1String local_3b8;
  char local_3a1;
  QLatin1String local_3a0;
  char local_389;
  QLatin1String local_388;
  char local_371;
  QLatin1String local_370;
  char local_359;
  QLatin1String local_358;
  char local_341;
  pair<char,_QLatin1String> local_340;
  pair<char,_QLatin1String> pStack_328;
  pair<char,_QLatin1String> pStack_310;
  pair<char,_QLatin1String> pStack_2f8;
  pair<char,_QLatin1String> pStack_2e0;
  pair<char,_QLatin1String> pStack_2c8;
  pair<char,_QLatin1String> pStack_2b0;
  pair<char,_QLatin1String> pStack_298;
  pair<char,_QLatin1String> pStack_280;
  pair<char,_QLatin1String> pStack_268;
  pair<char,_QLatin1String> pStack_250;
  pair<char,_QLatin1String> pStack_238;
  pair<char,_QLatin1String> pStack_220;
  pair<char,_QLatin1String> pStack_208;
  pair<char,_QLatin1String> pStack_1f0;
  pair<char,_QLatin1String> pStack_1d8;
  pair<char,_QLatin1String> pStack_1c0;
  pair<char,_QLatin1String> pStack_1a8;
  pair<char,_QLatin1String> pStack_190;
  pair<char,_QLatin1String> pStack_178;
  pair<char,_QLatin1String> pStack_160;
  pair<char,_QLatin1String> pStack_148;
  pair<char,_QLatin1String> pStack_130;
  pair<char,_QLatin1String> pStack_118;
  pair<char,_QLatin1String> pStack_100;
  pair<char,_QLatin1String> pStack_e8;
  pair<char,_QLatin1String> pStack_d0;
  pair<char,_QLatin1String> pStack_b8;
  pair<char,_QLatin1String> pStack_a0;
  pair<char,_QLatin1String> pStack_88;
  pair<char,_QLatin1String> pStack_70;
  pair<char,_QLatin1String> pStack_58;
  pair<char,_QLatin1String> pStack_40;
  iterator local_28;
  undefined8 local_20;
  QMultiHash<char,_QLatin1String> local_18;
  
  local_341 = 'a';
  QLatin1String::QLatin1String(&local_358,"and");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&local_340,&local_341,&local_358);
  local_359 = 'e';
  QLatin1String::QLatin1String(&local_370,"elif");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_328,&local_359,&local_370)
  ;
  local_371 = 'i';
  QLatin1String::QLatin1String(&local_388,"is");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_310,&local_371,&local_388)
  ;
  local_389 = 'g';
  QLatin1String::QLatin1String(&local_3a0,"global");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_2f8,&local_389,&local_3a0)
  ;
  local_3a1 = 'a';
  QLatin1String::QLatin1String(&local_3b8,"as");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_2e0,&local_3a1,&local_3b8)
  ;
  local_3b9 = 'i';
  QLatin1String::QLatin1String(&local_3d0,"in");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_2c8,&local_3b9,&local_3d0)
  ;
  local_3d1 = 'i';
  QLatin1String::QLatin1String(&local_3e8,"if");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_2b0,&local_3d1,&local_3e8)
  ;
  local_3e9 = 'f';
  QLatin1String::QLatin1String(&local_400,"from");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_298,&local_3e9,&local_400)
  ;
  local_401 = 'r';
  QLatin1String::QLatin1String(&local_418,"raise");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_280,&local_401,&local_418)
  ;
  local_419 = 'f';
  QLatin1String::QLatin1String(&local_430,"for");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_268,&local_419,&local_430)
  ;
  local_431 = 'e';
  QLatin1String::QLatin1String(&local_448,"except");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_250,&local_431,&local_448)
  ;
  local_449 = 'f';
  QLatin1String::QLatin1String(&local_460,"finally");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_238,&local_449,&local_460)
  ;
  local_461 = 'p';
  QLatin1String::QLatin1String(&local_478,"print");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_220,&local_461,&local_478)
  ;
  local_479 = 'p';
  QLatin1String::QLatin1String(&local_490,"pass");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_208,&local_479,&local_490)
  ;
  local_491 = 'r';
  QLatin1String::QLatin1String(&local_4a8,"return");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_1f0,&local_491,&local_4a8)
  ;
  local_4a9 = 'e';
  QLatin1String::QLatin1String(&local_4c0,"exec");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_1d8,&local_4a9,&local_4c0)
  ;
  local_4c1 = 'e';
  QLatin1String::QLatin1String(&local_4d8,"else");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_1c0,&local_4c1,&local_4d8)
  ;
  local_4d9 = 'b';
  QLatin1String::QLatin1String(&local_4f0,"break");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_1a8,&local_4d9,&local_4f0)
  ;
  local_4f1 = 'n';
  QLatin1String::QLatin1String(&local_508,"not");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_190,&local_4f1,&local_508)
  ;
  local_509 = 'w';
  QLatin1String::QLatin1String(&local_520,"with");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_178,&local_509,&local_520)
  ;
  local_521 = 'c';
  QLatin1String::QLatin1String(&local_538,"class");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_160,&local_521,&local_538)
  ;
  local_539 = 'a';
  QLatin1String::QLatin1String(&local_550,"assert");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_148,&local_539,&local_550)
  ;
  local_551 = 'y';
  QLatin1String::QLatin1String(&local_568,"yield");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_130,&local_551,&local_568)
  ;
  local_569 = 't';
  QLatin1String::QLatin1String(&local_580,"try");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_118,&local_569,&local_580)
  ;
  local_581 = 'w';
  QLatin1String::QLatin1String(&local_598,"while");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_100,&local_581,&local_598)
  ;
  local_599 = 'c';
  QLatin1String::QLatin1String(&local_5b0,"continue");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_e8,&local_599,&local_5b0);
  local_5b1 = 'd';
  QLatin1String::QLatin1String(&local_5c8,"del");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_d0,&local_5b1,&local_5c8);
  local_5c9 = 'o';
  QLatin1String::QLatin1String(&local_5e0,"or");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_b8,&local_5c9,&local_5e0);
  local_5e1 = 'd';
  QLatin1String::QLatin1String(&local_5f8,"def");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_a0,&local_5e1,&local_5f8);
  local_5f9 = 'l';
  QLatin1String::QLatin1String(&local_610,"lambda");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_88,&local_5f9,&local_610);
  local_611 = 'a';
  QLatin1String::QLatin1String(&local_628,"async");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_70,&local_611,&local_628);
  local_629 = 'a';
  QLatin1String::QLatin1String(&local_640,"await");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_58,&local_629,&local_640);
  local_641 = 'n';
  QLatin1String::QLatin1String(&local_658,"nonlocal");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_40,&local_641,&local_658);
  local_28 = &local_340;
  local_20 = 0x21;
  list_02._M_len = 0x21;
  list_02._M_array = local_28;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_18,list_02);
  QMultiHash<char,_QLatin1String>::operator=(&py_keywords,&local_18);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_18);
  memset(&local_668,0,0x10);
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_668);
  QMultiHash<char,_QLatin1String>::operator=(&py_types,&local_668);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_668);
  local_6d1 = 'F';
  QLatin1String::QLatin1String(&local_6e8,"False");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&local_6d0,&local_6d1,&local_6e8);
  local_6e9 = 'T';
  QLatin1String::QLatin1String(&local_700,"True");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_6b8,&local_6e9,&local_700)
  ;
  local_701 = 'N';
  QLatin1String::QLatin1String(&local_718,"None");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_6a0,&local_701,&local_718)
  ;
  local_688 = &local_6d0;
  local_680 = 3;
  list_01._M_len = 3;
  list_01._M_array = local_688;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_678,list_01);
  QMultiHash<char,_QLatin1String>::operator=(&py_literals,&local_678);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_678);
  local_ed1 = '_';
  QLatin1String::QLatin1String(&local_ee8,"__import__");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&local_ed0,&local_ed1,&local_ee8);
  local_ee9 = 'a';
  QLatin1String::QLatin1String(&local_f00,"abs");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_eb8,&local_ee9,&local_f00)
  ;
  local_f01 = 'a';
  QLatin1String::QLatin1String(&local_f18,"all");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_ea0,&local_f01,&local_f18)
  ;
  local_f19 = 'a';
  QLatin1String::QLatin1String(&local_f30,"any");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_e88,&local_f19,&local_f30)
  ;
  local_f31 = 'a';
  QLatin1String::QLatin1String(&local_f48,"apply");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_e70,&local_f31,&local_f48)
  ;
  local_f49 = 'a';
  QLatin1String::QLatin1String(&local_f60,"ascii");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_e58,&local_f49,&local_f60)
  ;
  local_f61 = 'b';
  QLatin1String::QLatin1String(&local_f78,"basestring");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_e40,&local_f61,&local_f78)
  ;
  local_f79 = 'b';
  QLatin1String::QLatin1String(&local_f90,"bin");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_e28,&local_f79,&local_f90)
  ;
  local_f91 = 'b';
  QLatin1String::QLatin1String(&local_fa8,"bool");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_e10,&local_f91,&local_fa8)
  ;
  local_fa9 = 'b';
  QLatin1String::QLatin1String(&local_fc0,"buffer");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_df8,&local_fa9,&local_fc0)
  ;
  local_fc1 = 'b';
  QLatin1String::QLatin1String(&local_fd8,"bytearray");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_de0,&local_fc1,&local_fd8)
  ;
  local_fd9 = 'b';
  QLatin1String::QLatin1String(&local_ff0,"bytes");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_dc8,&local_fd9,&local_ff0)
  ;
  local_ff1 = 'c';
  QLatin1String::QLatin1String(&local_1008,"callable");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_db0,&local_ff1,&local_1008);
  local_1009 = 'c';
  QLatin1String::QLatin1String(&local_1020,"chr");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d98,&local_1009,&local_1020);
  local_1021 = 'c';
  QLatin1String::QLatin1String(&local_1038,"classmethod");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d80,&local_1021,&local_1038);
  local_1039 = 'c';
  QLatin1String::QLatin1String(&local_1050,"cmp");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d68,&local_1039,&local_1050);
  local_1051 = 'c';
  QLatin1String::QLatin1String(&local_1068,"coerce");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d50,&local_1051,&local_1068);
  local_1069 = 'c';
  QLatin1String::QLatin1String(&local_1080,"compile");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d38,&local_1069,&local_1080);
  local_1081 = 'c';
  QLatin1String::QLatin1String(&local_1098,"complex");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d20,&local_1081,&local_1098);
  local_1099 = 'd';
  QLatin1String::QLatin1String(&local_10b0,"delattr");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d08,&local_1099,&local_10b0);
  local_10b1 = 'd';
  QLatin1String::QLatin1String(&local_10c8,"dict");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_cf0,&local_10b1,&local_10c8);
  local_10c9 = 'd';
  QLatin1String::QLatin1String(&local_10e0,"dir");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_cd8,&local_10c9,&local_10e0);
  local_10e1 = 'd';
  QLatin1String::QLatin1String(&local_10f8,"divmod");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_cc0,&local_10e1,&local_10f8);
  local_10f9 = 'e';
  QLatin1String::QLatin1String(&local_1110,"enumerate");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ca8,&local_10f9,&local_1110);
  local_1111 = 'e';
  QLatin1String::QLatin1String(&local_1128,"eval");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c90,&local_1111,&local_1128);
  local_1129 = 'e';
  QLatin1String::QLatin1String(&local_1140,"execfile");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c78,&local_1129,&local_1140);
  local_1141 = 'f';
  QLatin1String::QLatin1String(&local_1158,"file");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c60,&local_1141,&local_1158);
  local_1159 = 'f';
  QLatin1String::QLatin1String(&local_1170,"filter");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c48,&local_1159,&local_1170);
  local_1171 = 'f';
  QLatin1String::QLatin1String(&local_1188,"float");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c30,&local_1171,&local_1188);
  local_1189 = 'f';
  QLatin1String::QLatin1String(&local_11a0,"format");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c18,&local_1189,&local_11a0);
  local_11a1 = 'f';
  QLatin1String::QLatin1String(&local_11b8,"frozenset");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c00,&local_11a1,&local_11b8);
  local_11b9 = 'g';
  QLatin1String::QLatin1String(&local_11d0,"getattr");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_be8,&local_11b9,&local_11d0);
  local_11d1 = 'g';
  QLatin1String::QLatin1String(&local_11e8,"globals");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_bd0,&local_11d1,&local_11e8);
  local_11e9 = 'h';
  QLatin1String::QLatin1String(&local_1200,"hasattr");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_bb8,&local_11e9,&local_1200);
  local_1201 = 'h';
  QLatin1String::QLatin1String(&local_1218,"hash");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ba0,&local_1201,&local_1218);
  local_1219 = 'h';
  QLatin1String::QLatin1String(&local_1230,"help");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b88,&local_1219,&local_1230);
  local_1231 = 'h';
  QLatin1String::QLatin1String(&local_1248,"hex");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b70,&local_1231,&local_1248);
  local_1249 = 'i';
  QLatin1String::QLatin1String(&local_1260,"id");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b58,&local_1249,&local_1260);
  local_1261 = 'i';
  QLatin1String::QLatin1String(&local_1278,"input");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b40,&local_1261,&local_1278);
  local_1279 = 'i';
  QLatin1String::QLatin1String(&local_1290,"int");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b28,&local_1279,&local_1290);
  local_1291 = 'i';
  QLatin1String::QLatin1String(&local_12a8,"intern");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b10,&local_1291,&local_12a8);
  local_12a9 = 'i';
  QLatin1String::QLatin1String(&local_12c0,"isinstance");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_af8,&local_12a9,&local_12c0);
  local_12c1 = 'i';
  QLatin1String::QLatin1String(&local_12d8,"issubclass");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ae0,&local_12c1,&local_12d8);
  local_12d9 = 'i';
  QLatin1String::QLatin1String(&local_12f0,"iter");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ac8,&local_12d9,&local_12f0);
  local_12f1 = 'l';
  QLatin1String::QLatin1String(&local_1308,"len");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ab0,&local_12f1,&local_1308);
  local_1309 = 'l';
  QLatin1String::QLatin1String(&local_1320,"list");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a98,&local_1309,&local_1320);
  local_1321 = 'l';
  QLatin1String::QLatin1String(&local_1338,"locals");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a80,&local_1321,&local_1338);
  local_1339 = 'l';
  QLatin1String::QLatin1String(&local_1350,"long");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a68,&local_1339,&local_1350);
  local_1351 = 'm';
  QLatin1String::QLatin1String(&local_1368,"map");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a50,&local_1351,&local_1368);
  local_1369 = 'm';
  QLatin1String::QLatin1String(&local_1380,"max");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a38,&local_1369,&local_1380);
  local_1381 = 'm';
  QLatin1String::QLatin1String(&local_1398,"memoryview");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a20,&local_1381,&local_1398);
  local_1399 = 'm';
  QLatin1String::QLatin1String(&local_13b0,"min");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a08,&local_1399,&local_13b0);
  local_13b1 = 'n';
  QLatin1String::QLatin1String(&local_13c8,"next");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_9f0,&local_13b1,&local_13c8);
  local_13c9 = 'o';
  QLatin1String::QLatin1String(&local_13e0,"object");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_9d8,&local_13c9,&local_13e0);
  local_13e1 = 'o';
  QLatin1String::QLatin1String(&local_13f8,"oct");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_9c0,&local_13e1,&local_13f8);
  local_13f9 = 'o';
  QLatin1String::QLatin1String(&local_1410,"open");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_9a8,&local_13f9,&local_1410);
  local_1411 = 'o';
  QLatin1String::QLatin1String(&local_1428,"ord");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_990,&local_1411,&local_1428);
  local_1429 = 'p';
  QLatin1String::QLatin1String(&local_1440,"pow");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_978,&local_1429,&local_1440);
  local_1441 = 'p';
  QLatin1String::QLatin1String(&local_1458,"property");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_960,&local_1441,&local_1458);
  local_1459 = 'r';
  QLatin1String::QLatin1String(&local_1470,"range");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_948,&local_1459,&local_1470);
  local_1471 = 'r';
  QLatin1String::QLatin1String(&local_1488,"raw_input");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_930,&local_1471,&local_1488);
  local_1489 = 'r';
  QLatin1String::QLatin1String(&local_14a0,"reduce");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_918,&local_1489,&local_14a0);
  local_14a1 = 'r';
  QLatin1String::QLatin1String(&local_14b8,"reload");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_900,&local_14a1,&local_14b8);
  local_14b9 = 'r';
  QLatin1String::QLatin1String(&local_14d0,"repr");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_8e8,&local_14b9,&local_14d0);
  local_14d1 = 'r';
  QLatin1String::QLatin1String(&local_14e8,"reversed");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_8d0,&local_14d1,&local_14e8);
  local_14e9 = 'r';
  QLatin1String::QLatin1String(&local_1500,"round");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_8b8,&local_14e9,&local_1500);
  local_1501 = 's';
  QLatin1String::QLatin1String(&local_1518,"set");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_8a0,&local_1501,&local_1518);
  local_1519 = 's';
  QLatin1String::QLatin1String(&local_1530,"setattr");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_888,&local_1519,&local_1530);
  local_1531 = 's';
  QLatin1String::QLatin1String(&local_1548,"slice");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_870,&local_1531,&local_1548);
  local_1549 = 's';
  QLatin1String::QLatin1String(&local_1560,"sorted");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_858,&local_1549,&local_1560);
  local_1561 = 's';
  QLatin1String::QLatin1String(&local_1578,"staticmethod");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_840,&local_1561,&local_1578);
  local_1579 = 's';
  QLatin1String::QLatin1String(&local_1590,"str");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_828,&local_1579,&local_1590);
  local_1591 = 's';
  QLatin1String::QLatin1String(&local_15a8,"sum");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_810,&local_1591,&local_15a8);
  local_15a9 = 's';
  QLatin1String::QLatin1String(&local_15c0,"super");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_7f8,&local_15a9,&local_15c0);
  local_15c1 = 't';
  QLatin1String::QLatin1String(&local_15d8,"tuple");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_7e0,&local_15c1,&local_15d8);
  local_15d9 = 't';
  QLatin1String::QLatin1String(&local_15f0,"type");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_7c8,&local_15d9,&local_15f0);
  local_15f1 = 'u';
  QLatin1String::QLatin1String(&local_1608,"unichr");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_7b0,&local_15f1,&local_1608);
  local_1609 = 'u';
  QLatin1String::QLatin1String(&local_1620,"unicode");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_798,&local_1609,&local_1620);
  local_1621 = 'v';
  QLatin1String::QLatin1String(&local_1638,"vars");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_780,&local_1621,&local_1638);
  local_1639 = 'x';
  QLatin1String::QLatin1String(&local_1650,"xrange");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_768,&local_1639,&local_1650);
  local_1651 = 'z';
  QLatin1String::QLatin1String(&local_1668,"zip");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_750,&local_1651,&local_1668);
  local_738 = &local_ed0;
  local_730 = 0x51;
  list_00._M_len = 0x51;
  list_00._M_array = local_738;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_728,list_00);
  QMultiHash<char,_QLatin1String>::operator=(&py_builtin,&local_728);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_728);
  local_16a1 = 'i';
  QLatin1String::QLatin1String(&local_16b8,"import");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&local_16a0,&local_16a1,&local_16b8);
  local_1688 = &local_16a0;
  local_1680 = 1;
  list._M_len = 1;
  list._M_array = local_1688;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_1678,list);
  QMultiHash<char,_QLatin1String>::operator=(&py_other,&local_1678);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_1678);
  return;
}

Assistant:

void initPyData() {
    py_keywords = {
        {('a'), QLatin1String("and")},      {('e'), QLatin1String("elif")},
        {('i'), QLatin1String("is")},       {('g'), QLatin1String("global")},
        {('a'), QLatin1String("as")},       {('i'), QLatin1String("in")},
        {('i'), QLatin1String("if")},       {('f'), QLatin1String("from")},
        {('r'), QLatin1String("raise")},    {('f'), QLatin1String("for")},
        {('e'), QLatin1String("except")},   {('f'), QLatin1String("finally")},
        {('p'), QLatin1String("print")},    {('p'), QLatin1String("pass")},
        {('r'), QLatin1String("return")},   {('e'), QLatin1String("exec")},
        {('e'), QLatin1String("else")},     {('b'), QLatin1String("break")},
        {('n'), QLatin1String("not")},      {('w'), QLatin1String("with")},
        {('c'), QLatin1String("class")},    {('a'), QLatin1String("assert")},
        {('y'), QLatin1String("yield")},    {('t'), QLatin1String("try")},
        {('w'), QLatin1String("while")},    {('c'), QLatin1String("continue")},
        {('d'), QLatin1String("del")},      {('o'), QLatin1String("or")},
        {('d'), QLatin1String("def")},      {('l'), QLatin1String("lambda")},
        {('a'), QLatin1String("async")},    {('a'), QLatin1String("await")},
        {('n'), QLatin1String("nonlocal")},
    };

    py_types = {

    };

    py_literals = {{('F'), QLatin1String("False")},
                   {('T'), QLatin1String("True")},
                   {('N'), QLatin1String("None")}};

    py_builtin = {{('_'), QLatin1String("__import__")},
                  {('a'), QLatin1String("abs")},
                  {('a'), QLatin1String("all")},
                  {('a'), QLatin1String("any")},
                  {('a'), QLatin1String("apply")},
                  {('a'), QLatin1String("ascii")},
                  {('b'), QLatin1String("basestring")},
                  {('b'), QLatin1String("bin")},
                  {('b'), QLatin1String("bool")},
                  {('b'), QLatin1String("buffer")},
                  {('b'), QLatin1String("bytearray")},
                  {('b'), QLatin1String("bytes")},
                  {('c'), QLatin1String("callable")},
                  {('c'), QLatin1String("chr")},
                  {('c'), QLatin1String("classmethod")},
                  {('c'), QLatin1String("cmp")},
                  {('c'), QLatin1String("coerce")},
                  {('c'), QLatin1String("compile")},
                  {('c'), QLatin1String("complex")},
                  {('d'), QLatin1String("delattr")},
                  {('d'), QLatin1String("dict")},
                  {('d'), QLatin1String("dir")},
                  {('d'), QLatin1String("divmod")},
                  {('e'), QLatin1String("enumerate")},
                  {('e'), QLatin1String("eval")},
                  {('e'), QLatin1String("execfile")},
                  {('f'), QLatin1String("file")},
                  {('f'), QLatin1String("filter")},
                  {('f'), QLatin1String("float")},
                  {('f'), QLatin1String("format")},
                  {('f'), QLatin1String("frozenset")},
                  {('g'), QLatin1String("getattr")},
                  {('g'), QLatin1String("globals")},
                  {('h'), QLatin1String("hasattr")},
                  {('h'), QLatin1String("hash")},
                  {('h'), QLatin1String("help")},
                  {('h'), QLatin1String("hex")},
                  {('i'), QLatin1String("id")},
                  {('i'), QLatin1String("input")},
                  {('i'), QLatin1String("int")},
                  {('i'), QLatin1String("intern")},
                  {('i'), QLatin1String("isinstance")},
                  {('i'), QLatin1String("issubclass")},
                  {('i'), QLatin1String("iter")},
                  {('l'), QLatin1String("len")},
                  {('l'), QLatin1String("list")},
                  {('l'), QLatin1String("locals")},
                  {('l'), QLatin1String("long")},
                  {('m'), QLatin1String("map")},
                  {('m'), QLatin1String("max")},
                  {('m'), QLatin1String("memoryview")},
                  {('m'), QLatin1String("min")},
                  {('n'), QLatin1String("next")},
                  {('o'), QLatin1String("object")},
                  {('o'), QLatin1String("oct")},
                  {('o'), QLatin1String("open")},
                  {('o'), QLatin1String("ord")},
                  {('p'), QLatin1String("pow")},
                  {('p'), QLatin1String("property")},
                  {('r'), QLatin1String("range")},
                  {('r'), QLatin1String("raw_input")},
                  {('r'), QLatin1String("reduce")},
                  {('r'), QLatin1String("reload")},
                  {('r'), QLatin1String("repr")},
                  {('r'), QLatin1String("reversed")},
                  {('r'), QLatin1String("round")},
                  {('s'), QLatin1String("set")},
                  {('s'), QLatin1String("setattr")},
                  {('s'), QLatin1String("slice")},
                  {('s'), QLatin1String("sorted")},
                  {('s'), QLatin1String("staticmethod")},
                  {('s'), QLatin1String("str")},
                  {('s'), QLatin1String("sum")},
                  {('s'), QLatin1String("super")},
                  {('t'), QLatin1String("tuple")},
                  {('t'), QLatin1String("type")},
                  {('u'), QLatin1String("unichr")},
                  {('u'), QLatin1String("unicode")},
                  {('v'), QLatin1String("vars")},
                  {('x'), QLatin1String("xrange")},
                  {('z'), QLatin1String("zip")}};

    py_other = {{('i'), QLatin1String("import")}};
}